

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O3

ParamIteratorInterface<BLOCK_SIZE> * __thiscall
testing::internal::ValuesInIteratorRangeGenerator<BLOCK_SIZE>::Iterator::Clone(Iterator *this)

{
  ParamIteratorInterface<BLOCK_SIZE> *pPVar1;
  
  pPVar1 = (ParamIteratorInterface<BLOCK_SIZE> *)operator_new(0x20);
  pPVar1->_vptr_ParamIteratorInterface = (_func_int **)&PTR__Iterator_00ffa618;
  pPVar1[1]._vptr_ParamIteratorInterface = (_func_int **)this->base_;
  pPVar1[2]._vptr_ParamIteratorInterface = (_func_int **)(this->iterator_)._M_current;
  pPVar1[3]._vptr_ParamIteratorInterface = (_func_int **)0x0;
  return pPVar1;
}

Assistant:

ParamIteratorInterface<T>* Clone() const override {
      return new Iterator(*this);
    }